

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

UCVarValue FBaseCVar::FromGUID(GUID *guid,ECVarType type)

{
  ECVarType type_local;
  GUID *guid_local;
  UCVarValue ret;
  
  switch(type) {
  case CVAR_Bool:
    guid_local = (GUID *)((ulong)guid_local & 0xffffffffffffff00);
    break;
  case CVAR_Int:
    guid_local = (GUID *)((ulong)guid_local._4_4_ << 0x20);
    break;
  case CVAR_Float:
    guid_local = (GUID *)((ulong)guid_local._4_4_ << 0x20);
    break;
  case CVAR_String:
    guid_local = (GUID *)ToString((UCVarValue)guid,CVAR_GUID);
    break;
  default:
    break;
  case CVAR_GUID:
    guid_local = guid;
  }
  return (UCVarValue)guid_local.String;
}

Assistant:

UCVarValue FBaseCVar::FromGUID (const GUID &guid, ECVarType type)
{
	UCVarValue ret;

	switch (type)
	{
	case CVAR_Bool:
		ret.Bool = false;
		break;

	case CVAR_Int:
		ret.Int = 0;
		break;

	case CVAR_Float:
		ret.Float = 0.f;
		break;

	case CVAR_String:
		ret.pGUID = &guid;
		ret.String = ToString (ret, CVAR_GUID);
		break;

	case CVAR_GUID:
		ret.pGUID = &guid;
		break;

	default:
		break;
	}

	return ret;
}